

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

SequenceDeclarationSyntax * __thiscall
slang::parsing::Parser::parseSequenceDeclaration(Parser *this,AttrList attributes)

{
  bool bVar1;
  int iVar2;
  AssertionItemPortListSyntax *portList;
  SequenceExprSyntax *seqExpr;
  NamedBlockClauseSyntax *endBlock;
  undefined4 extraout_var;
  SequenceDeclarationSyntax *pSVar3;
  EVP_PKEY_CTX *src;
  Token keyword;
  Token nameToken;
  Token semi;
  Token optionalSemi;
  Token end;
  SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL> declarations;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_e0;
  SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> local_a8 [2];
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> local_68;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  nameToken = ParserBase::expect(&this->super_ParserBase,Identifier);
  portList = parseAssertionItemPortList(this,SequenceDeclaration);
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 5;
  while( true ) {
    bVar1 = isLocalVariableDeclaration(this);
    if (!bVar1) break;
    local_e0.super_SyntaxListBase._vptr_SyntaxListBase =
         (_func_int **)parseLocalVariableDeclaration(this);
    SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*>::
    emplace_back<slang::syntax::LocalVariableDeclarationSyntax*>
              ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*> *)local_a8,
               (LocalVariableDeclarationSyntax **)&local_e0);
  }
  seqExpr = parseSequenceExpr(this,0,false);
  optionalSemi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  end = ParserBase::expect(&this->super_ParserBase,EndSequenceKeyword);
  endBlock = parseNamedBlockClause(this);
  checkBlockNames(this,nameToken,endBlock);
  local_e0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_e0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_e0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_e0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005bad98;
  local_e0.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
  local_e0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_e0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  iVar2 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::copy
                    (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_68.super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>.
  _M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005bbdf8;
  pSVar3 = slang::syntax::SyntaxFactory::sequenceDeclaration
                     (&this->factory,&local_e0,keyword,nameToken,portList,semi,&local_68,seqExpr,
                      optionalSemi,end,endBlock);
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return pSVar3;
}

Assistant:

SequenceDeclarationSyntax& Parser::parseSequenceDeclaration(AttrList attributes) {
    auto keyword = consume();
    auto name = expect(TokenKind::Identifier);
    auto portList = parseAssertionItemPortList(SyntaxKind::SequenceDeclaration);
    auto semi = expect(TokenKind::Semicolon);

    SmallVector<LocalVariableDeclarationSyntax*> declarations;
    while (isLocalVariableDeclaration())
        declarations.push_back(&parseLocalVariableDeclaration());

    auto& expr = parseSequenceExpr(0, /* isInProperty */ false);
    auto semi2 = expect(TokenKind::Semicolon);
    auto end = expect(TokenKind::EndSequenceKeyword);

    auto blockName = parseNamedBlockClause();
    checkBlockNames(name, blockName);

    return factory.sequenceDeclaration(attributes, keyword, name, portList, semi,
                                       declarations.copy(alloc), expr, semi2, end, blockName);
}